

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O0

int adl_switchEmulator(ADL_MIDIPlayer *device,int emulator)

{
  MIDIplay *this;
  bool bVar1;
  allocator local_49;
  string local_48;
  MIDIplay *local_28;
  MidiPlayer *play;
  ADL_MIDIPlayer *pAStack_18;
  int emulator_local;
  ADL_MIDIPlayer *device_local;
  
  if (device != (ADL_MIDIPlayer *)0x0) {
    local_28 = (MIDIplay *)device->adl_midiPlayer;
    play._4_4_ = emulator;
    pAStack_18 = device;
    if (local_28 == (MIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                    ,0x354,"int adl_switchEmulator(struct ADL_MIDIPlayer *, int)");
    }
    bVar1 = adl_isEmulatorAvailable(emulator);
    this = local_28;
    if (bVar1) {
      (local_28->m_setup).emulator = play._4_4_;
      MIDIplay::partialReset(local_28);
      return 0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"OPL3 MIDI: Unknown emulation core!",&local_49)
    ;
    MIDIplay::setErrorString(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return -1;
}

Assistant:

ADLMIDI_EXPORT int adl_switchEmulator(struct ADL_MIDIPlayer *device, int emulator)
{
    if(device)
    {
        MidiPlayer *play = GET_MIDI_PLAYER(device);
        assert(play);
        if(adl_isEmulatorAvailable(emulator))
        {
            play->m_setup.emulator = emulator;
#ifdef ADLMIDI_ENABLE_HW_SERIAL
            play->m_setup.serial = false;
#endif
            play->partialReset();
            return 0;
        }
        play->setErrorString("OPL3 MIDI: Unknown emulation core!");
    }
    return -1;
}